

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

EGLDisplay eglu::getDisplay(NativeDisplay *nativeDisplay)

{
  Capability CVar1;
  EGLenum EVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EGLDisplay pvVar6;
  TestError *pTVar7;
  Library *egl;
  char *__s;
  pointer_____offset_0x10___ *ppuVar8;
  allocator<char> local_a2;
  allocator<char> local_a1;
  vector<int,_std::allocator<int>_> legacyAttribs;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  platformExts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  eglu *this;
  
  iVar4 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  this = (eglu *)CONCAT44(extraout_var,iVar4);
  CVar1 = nativeDisplay->m_capabilities;
  if ((CVar1 & (CAPABILITY_GET_DISPLAY_PLATFORM|CAPABILITY_GET_DISPLAY_LEGACY)) == 0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              ((InternalError *)pTVar7,(char *)0x0,
               "supportsLegacyGetDisplay || supportsPlatformGetDisplay",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0xeb);
  }
  else {
    if ((CVar1 & CAPABILITY_GET_DISPLAY_PLATFORM) != 0) {
      getClientExtensions_abi_cxx11_(&platformExts,this,egl);
      local_68._M_current =
           platformExts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_70._M_current =
           platformExts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&legacyAttribs,"EGL_EXT_platform_base",&local_a1);
      bVar3 = de::
              contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                        (&local_68,&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &legacyAttribs);
      if (bVar3) {
        local_78._M_current =
             platformExts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_80._M_current =
             platformExts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        __s = (char *)(nativeDisplay->m_platformExtension)._M_string_length;
        if (__s != (char *)0x0) {
          __s = (nativeDisplay->m_platformExtension)._M_dataplus._M_p;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_a2);
        bVar3 = de::
                contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (&local_78,&local_80,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&legacyAttribs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&platformExts);
        if (bVar3) {
          iVar4 = (*nativeDisplay->_vptr_NativeDisplay[5])(nativeDisplay);
          toLegacyAttribList(&legacyAttribs,(EGLAttrib *)CONCAT44(extraout_var_00,iVar4));
          EVar2 = nativeDisplay->m_platformType;
          iVar4 = (*nativeDisplay->_vptr_NativeDisplay[4])(nativeDisplay);
          pvVar6 = (EGLDisplay)
                   (**(code **)(*(long *)this + 0x108))
                             (this,EVar2,iVar4,
                              legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
          dVar5 = (**(code **)(*(long *)this + 0xf8))(this);
          checkError(dVar5,"eglGetPlatformDisplayEXT()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                     ,0xf9);
          if (pvVar6 != (EGLDisplay)0x0) {
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&legacyAttribs.super__Vector_base<int,_std::allocator<int>_>);
            return pvVar6;
          }
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,(char *)0x0,"display != EGL_NO_DISPLAY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                     ,0xfa);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&legacyAttribs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&platformExts);
      }
    }
    if ((CVar1 & CAPABILITY_GET_DISPLAY_LEGACY) != 0) {
      iVar4 = (*nativeDisplay->_vptr_NativeDisplay[3])(nativeDisplay);
      pvVar6 = (EGLDisplay)(**(code **)(*(long *)this + 0xf0))(this,iVar4);
      dVar5 = (**(code **)(*(long *)this + 0xf8))(this);
      checkError(dVar5,"eglGetDisplay()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0xff);
      if (pvVar6 != (EGLDisplay)0x0) {
        return pvVar6;
      }
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,(char *)0x0,"display != EGL_NO_DISPLAY",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x100);
      ppuVar8 = &tcu::TestError::typeinfo;
      goto LAB_00e29ad9;
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              ((InternalError *)pTVar7,"No supported way to get EGL display",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x103);
  }
  ppuVar8 = &tcu::InternalError::typeinfo;
LAB_00e29ad9:
  __cxa_throw(pTVar7,ppuVar8,tcu::Exception::~Exception);
}

Assistant:

EGLDisplay getDisplay (NativeDisplay& nativeDisplay)
{
	const Library&	egl								= nativeDisplay.getLibrary();
	const bool		supportsLegacyGetDisplay		= (nativeDisplay.getCapabilities() & NativeDisplay::CAPABILITY_GET_DISPLAY_LEGACY) != 0;
	const bool		supportsPlatformGetDisplay		= (nativeDisplay.getCapabilities() & NativeDisplay::CAPABILITY_GET_DISPLAY_PLATFORM) != 0;
	bool			usePlatformExt					= false;
	EGLDisplay		display							= EGL_NO_DISPLAY;

	TCU_CHECK_INTERNAL(supportsLegacyGetDisplay || supportsPlatformGetDisplay);

	if (supportsPlatformGetDisplay)
	{
		const vector<string> platformExts = getClientExtensions(egl);
		usePlatformExt = de::contains(platformExts.begin(), platformExts.end(), string("EGL_EXT_platform_base")) &&
						 de::contains(platformExts.begin(), platformExts.end(), string(nativeDisplay.getPlatformExtensionName()));
	}

	if (usePlatformExt)
	{
		const vector<EGLint>	legacyAttribs	= toLegacyAttribList(nativeDisplay.getPlatformAttributes());

		display = egl.getPlatformDisplayEXT(nativeDisplay.getPlatformType(), nativeDisplay.getPlatformNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglGetPlatformDisplayEXT()");
		TCU_CHECK(display != EGL_NO_DISPLAY);
	}
	else if (supportsLegacyGetDisplay)
	{
		display = egl.getDisplay(nativeDisplay.getLegacyNative());
		EGLU_CHECK_MSG(egl, "eglGetDisplay()");
		TCU_CHECK(display != EGL_NO_DISPLAY);
	}
	else
		throw tcu::InternalError("No supported way to get EGL display", DE_NULL, __FILE__, __LINE__);

	DE_ASSERT(display != EGL_NO_DISPLAY);
	return display;
}